

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void __thiscall
duckdb::BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t>::CalculateDeltaStats
          (BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t> *this)

{
  uint64_t *puVar1;
  int64_t iVar2;
  bool bVar3;
  long lVar4;
  hugeint_t *phVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  hugeint_t hVar12;
  hugeint_t right;
  hugeint_t bogus;
  hugeint_t local_48;
  hugeint_t local_38;
  
  local_48.lower = 0xffffffffffffffff;
  local_48.upper = 0x7fffffffffffffff;
  bVar3 = hugeint_t::operator>(&this->maximum,&local_48);
  if (bVar3) {
    return;
  }
  if (this->compression_buffer_idx < 2) {
    return;
  }
  if (this->all_valid != true) {
    return;
  }
  bVar3 = TrySubtractOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                    (this->minimum,this->maximum,&local_48);
  if ((bVar3) &&
     (bVar3 = TrySubtractOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                        (this->maximum,this->minimum,&local_48), bVar3)) {
    if (0 < (long)this->compression_buffer_idx) {
      lVar4 = 0;
      lVar6 = 0;
      do {
        puVar1 = (uint64_t *)((long)&this->compression_buffer->lower + lVar4);
        local_48.lower = *puVar1;
        local_48.upper = puVar1[1];
        puVar1 = (uint64_t *)((long)&this->compression_buffer[-1].lower + lVar4);
        local_38.lower = *puVar1;
        local_38.upper = puVar1[1];
        hVar12 = hugeint_t::operator-(&local_48,&local_38);
        *(uint64_t *)((long)&this->delta_buffer[0].lower + lVar4) = hVar12.lower;
        *(int64_t *)((long)&this->delta_buffer[0].upper + lVar4) = hVar12.upper;
        lVar6 = lVar6 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar6 < (long)this->compression_buffer_idx);
    }
  }
  else if (0 < (long)this->compression_buffer_idx) {
    lVar6 = 0;
    lVar4 = 0;
    do {
      phVar5 = this->compression_buffer;
      hVar12.upper = *(int64_t *)((long)&phVar5->upper + lVar6);
      hVar12.lower = *(uint64_t *)((long)&phVar5->lower + lVar6);
      right.upper = *(int64_t *)((long)phVar5 + lVar6 + -8);
      right.lower = *(uint64_t *)((long)&phVar5[-1].lower + lVar6);
      bVar3 = TrySubtractOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                        (hVar12,right,(hugeint_t *)((long)&this->delta_buffer[0].lower + lVar6));
      if (!bVar3) {
        return;
      }
      lVar4 = lVar4 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar4 < (long)this->compression_buffer_idx);
  }
  this->can_do_delta = true;
  if (1 < this->compression_buffer_idx) {
    phVar5 = this->delta_buffer;
    uVar7 = 1;
    do {
      phVar5 = phVar5 + 1;
      local_48.lower = (this->maximum_delta).lower;
      local_48.upper = (this->maximum_delta).upper;
      local_38.lower = phVar5->lower;
      local_38.upper = phVar5->upper;
      bVar3 = hugeint_t::operator>(&local_48,&local_38);
      uVar11 = (uint)bVar3;
      uVar8 = (int)(uVar11 << 0x1f) >> 0x1f;
      uVar9 = (int)(uVar11 << 0x1f) >> 0x1f;
      uVar10 = (int)(uVar11 << 0x1f) >> 0x1f;
      uVar11 = (int)(uVar11 << 0x1f) >> 0x1f;
      *(uint *)&(this->maximum_delta).lower =
           uVar8 & (uint)local_48.lower | ~uVar8 & (uint)local_38.lower;
      *(uint *)((long)&(this->maximum_delta).lower + 4) =
           uVar9 & local_48.lower._4_4_ | ~uVar9 & local_38.lower._4_4_;
      *(uint *)&(this->maximum_delta).upper =
           uVar10 & (uint)local_48.upper | ~uVar10 & (uint)local_38.upper;
      *(uint *)((long)&(this->maximum_delta).upper + 4) =
           uVar11 & local_48.upper._4_4_ | ~uVar11 & local_38.upper._4_4_;
      local_48.lower = (this->minimum_delta).lower;
      local_48.upper = (this->minimum_delta).upper;
      local_38.lower = phVar5->lower;
      local_38.upper = phVar5->upper;
      bVar3 = hugeint_t::operator<(&local_48,&local_38);
      uVar11 = (uint)bVar3;
      uVar8 = (int)(uVar11 << 0x1f) >> 0x1f;
      uVar9 = (int)(uVar11 << 0x1f) >> 0x1f;
      uVar10 = (int)(uVar11 << 0x1f) >> 0x1f;
      uVar11 = (int)(uVar11 << 0x1f) >> 0x1f;
      *(uint *)&(this->minimum_delta).lower =
           uVar8 & (uint)local_48.lower | ~uVar8 & (uint)local_38.lower;
      *(uint *)((long)&(this->minimum_delta).lower + 4) =
           uVar9 & local_48.lower._4_4_ | ~uVar9 & local_38.lower._4_4_;
      *(uint *)&(this->minimum_delta).upper =
           uVar10 & (uint)local_48.upper | ~uVar10 & (uint)local_38.upper;
      *(uint *)((long)&(this->minimum_delta).upper + 4) =
           uVar11 & local_48.upper._4_4_ | ~uVar11 & local_38.upper._4_4_;
      uVar7 = uVar7 + 1;
    } while (uVar7 < this->compression_buffer_idx);
  }
  iVar2 = (this->minimum_delta).upper;
  this->delta_buffer[0].lower = (this->minimum_delta).lower;
  this->delta_buffer[0].upper = iVar2;
  if (this->can_do_delta == false) {
    this->can_do_delta = false;
  }
  else {
    bVar3 = TrySubtractOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                      (this->maximum_delta,this->minimum_delta,&this->min_max_delta_diff);
    this->can_do_delta = bVar3;
    if (bVar3) {
      bVar3 = TrySubtractOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                        (*this->compression_buffer,this->minimum_delta,&this->delta_offset);
      goto LAB_0174e2a9;
    }
  }
  bVar3 = false;
LAB_0174e2a9:
  this->can_do_delta = bVar3;
  return;
}

Assistant:

void CalculateDeltaStats() {
		// TODO: currently we dont support delta compression of values above NumericLimits<T_S>::Maximum(),
		// 		 we could support this with some clever substract trickery?
		if (maximum > static_cast<T>(NumericLimits<T_S>::Maximum())) {
			return;
		}

		// Don't delta encoding 1 value makes no sense
		if (compression_buffer_idx < 2) {
			return;
		}

		// TODO: handle NULLS here?
		// Currently we cannot handle nulls because we would need an additional step of patching for this.
		// we could for example copy the last value on a null insert. This would help a bit, but not be optimal for
		// large deltas since theres suddenly a zero then. Ideally we would insert a value that leads to a delta within
		// the current domain of deltas however we dont know that domain here yet
		if (!all_valid) {
			return;
		}

		// Note: since we dont allow any values over NumericLimits<T_S>::Maximum(), all subtractions for unsigned types
		// are guaranteed not to overflow
		bool can_do_all = true;
		if (NumericLimits<T>::IsSigned()) {
			T_S bogus;
			can_do_all = TrySubtractOperator::Operation(static_cast<T_S>(minimum), static_cast<T_S>(maximum), bogus) &&
			             TrySubtractOperator::Operation(static_cast<T_S>(maximum), static_cast<T_S>(minimum), bogus);
		}

		// Calculate delta's
		// compression_buffer pointer points one element ahead of the internal buffer making the use of signed index
		// integer (-1) possible
		D_ASSERT(compression_buffer_idx <= NumericLimits<int64_t>::Maximum());
		if (can_do_all) {
			for (int64_t i = 0; i < static_cast<int64_t>(compression_buffer_idx); i++) {
				delta_buffer[i] = static_cast<T_S>(compression_buffer[i]) - static_cast<T_S>(compression_buffer[i - 1]);
			}
		} else {
			for (int64_t i = 0; i < static_cast<int64_t>(compression_buffer_idx); i++) {
				auto success =
				    TrySubtractOperator::Operation(static_cast<T_S>(compression_buffer[i]),
				                                   static_cast<T_S>(compression_buffer[i - 1]), delta_buffer[i]);
				if (!success) {
					return;
				}
			}
		}

		can_do_delta = true;

		for (idx_t i = 1; i < compression_buffer_idx; i++) {
			maximum_delta = MaxValue<T_S>(maximum_delta, delta_buffer[i]);
			minimum_delta = MinValue<T_S>(minimum_delta, delta_buffer[i]);
		}

		// Since we can set the first value arbitrarily, we want to pick one from the current domain, note that
		// we will store the original first value - this offset as the  delta_offset to be able to decode this again.
		delta_buffer[0] = minimum_delta;

		can_do_delta = can_do_delta && TrySubtractOperator::Operation(maximum_delta, minimum_delta, min_max_delta_diff);
		can_do_delta = can_do_delta && TrySubtractOperator::Operation(static_cast<T_S>(compression_buffer[0]),
		                                                              minimum_delta, delta_offset);
	}